

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::PipelineLayoutVk::GetFirstDescrSetIndex(PipelineLayoutVk *this,Uint32 Index)

{
  Char *Message;
  byte *pbVar1;
  undefined1 local_38 [8];
  string msg;
  Uint32 Index_local;
  PipelineLayoutVk *this_local;
  
  msg.field_2._12_4_ = Index;
  if (this->m_DbgMaxBindIndex < Index) {
    FormatString<char[26],char[27]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index <= m_DbgMaxBindIndex",(char (*) [27])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetFirstDescrSetIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/PipelineLayoutVk.hpp"
               ,0x3a);
    std::__cxx11::string::~string((string *)local_38);
  }
  pbVar1 = std::array<unsigned_char,_8UL>::operator[]
                     (&this->m_FirstDescrSetIndex,(ulong)(uint)msg.field_2._12_4_);
  return (Uint32)*pbVar1;
}

Assistant:

Uint32 GetFirstDescrSetIndex(Uint32 Index) const
    {
        VERIFY_EXPR(Index <= m_DbgMaxBindIndex);
        return m_FirstDescrSetIndex[Index];
    }